

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkinformation_p.cpp
# Opt level: O1

void QNetworkInformationBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QNetworkInformationBackend_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined4 local_2c;
  void *local_28;
  undefined4 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((((code *)*plVar1 == reachabilityChanged) && (uVar2 = 0, plVar1[1] == 0)) ||
         (((code *)*plVar1 == behindCaptivePortalChanged && (uVar2 = 1, plVar1[1] == 0)))) ||
        (((code *)*plVar1 == transportMediumChanged && (uVar2 = 2, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == isMeteredChanged && (uVar2 = 3, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar2;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      local_2c = *_a[1];
      iVar3 = 0;
      break;
    case 1:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar3 = 1;
      break;
    case 2:
      local_2c = *_a[1];
      iVar3 = 2;
      break;
    case 3:
      local_2c = CONCAT31(local_2c._1_3_,*_a[1]);
      iVar3 = 3;
      break;
    default:
      goto LAB_001b7714;
    }
    puStack_20 = &local_2c;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar3,&local_28);
  }
LAB_001b7714:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkInformationBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkInformationBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->reachabilityChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::Reachability>>(_a[1]))); break;
        case 1: _t->behindCaptivePortalChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->transportMediumChanged((*reinterpret_cast< std::add_pointer_t<QNetworkInformation::TransportMedium>>(_a[1]))); break;
        case 3: _t->isMeteredChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::Reachability )>(_a, &QNetworkInformationBackend::reachabilityChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::behindCaptivePortalChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(QNetworkInformation::TransportMedium )>(_a, &QNetworkInformationBackend::transportMediumChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkInformationBackend::*)(bool )>(_a, &QNetworkInformationBackend::isMeteredChanged, 3))
            return;
    }
}